

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O0

int ReadChannelP33x(P33X *pP33x,uint8 Channel,float *pValue)

{
  int iVar1;
  float local_3c;
  uint8 local_38;
  uint8 local_37 [3];
  uFloat_P33X value;
  uint8 crc_l;
  uint8 crc_h;
  uint8 writebuf [5];
  uint8 readbuf [9];
  float *pValue_local;
  uint8 Channel_local;
  P33X *pP33x_local;
  
  local_37[0] = '\0';
  local_38 = '\0';
  local_37[1] = 0xfa;
  local_37[2] = 0x49;
  value.c[0] = Channel;
  CalcCRC16(local_37 + 1,3,value.c + 1,value.c + 2);
  iVar1 = WriteAllRS232Port(&pP33x->RS232Port,local_37 + 1,5);
  if (iVar1 == 0) {
    iVar1 = ReadAllRS232Port(&pP33x->RS232Port,value.c + 3,5);
    if (iVar1 == 0) {
      iVar1 = ReadAllRS232Port(&pP33x->RS232Port,value.c + 3,9);
      if (iVar1 == 0) {
        if (value.c[3] == 0xfa) {
          if (crc_l == 'I') {
            CalcCRC16(value.c + 3,7,local_37,&local_38);
            if ((writebuf[4] == local_37[0]) && (readbuf[0] == local_38)) {
              local_3c = (float)CONCAT31(CONCAT21(CONCAT11(crc_h,writebuf[0]),writebuf[1]),
                                         writebuf[2]);
              *pValue = local_3c;
              pP33x_local._4_4_ = 0;
            }
            else {
              printf("Error reading data from a P33x : Bad CRC-16. \n");
              pP33x_local._4_4_ = 1;
            }
          }
          else {
            printf("Error reading data from a P33x : The device function failed. \n");
            pP33x_local._4_4_ = 1;
          }
        }
        else {
          printf("Error reading data from a P33x : Bad device address. \n");
          pP33x_local._4_4_ = 1;
        }
      }
      else {
        printf("Error reading data from a P33x. \n");
        pP33x_local._4_4_ = 1;
      }
    }
    else {
      printf("Error reading data from a P33x. \n");
      pP33x_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a P33x. \n");
    pP33x_local._4_4_ = 1;
  }
  return pP33x_local._4_4_;
}

Assistant:

inline int ReadChannelP33x(P33X* pP33x, uint8 Channel, float* pValue)
{
	uint8 readbuf[9];
	uint8 writebuf[5];
	uint8 crc_h = 0;
	uint8 crc_l = 0;
	uFloat_P33X value;
	//int stat = 0;

	writebuf[0] = (uint8)0xfa; // device address = 250
	writebuf[1] = (uint8)0x49; // function 73
	writebuf[2] = (uint8)Channel; // Channel to read
	CalcCRC16(writebuf, 5-2, &(writebuf[3]), &(writebuf[4])); // CRC-16

	if (WriteAllRS232Port(&pP33x->RS232Port, writebuf, 5) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the echo.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 5) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the data.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 9) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Device address = 250.
	if (readbuf[0] != (uint8)0xfa)
	{ 
		printf("Error reading data from a P33x : Bad device address. \n");
		return EXIT_FAILURE;	
	}

	// Function 73.
	if (readbuf[1] != (uint8)0x49)
	{
		printf("Error reading data from a P33x : The device function failed. \n");
		return EXIT_FAILURE;	
	}

	CalcCRC16(readbuf, 9-2, &crc_h, &crc_l);

	// CRC-16.
	if ((readbuf[7] != crc_h)||(readbuf[8] != crc_l))
	{ 
		printf("Error reading data from a P33x : Bad CRC-16. \n");
		return EXIT_FAILURE;	
	}

	value.c[3] = readbuf[2];
	value.c[2] = readbuf[3];
	value.c[1] = readbuf[4];
	value.c[0] = readbuf[5];
	//stat = readbuf[6];

	*pValue = value.v;

	//PRINT_DEBUG_MESSAGE_OSUTILS(("Channel value : %f\n", (double)*pValue));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Status information : %d\n", stat));

	return EXIT_SUCCESS;
}